

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O1

void ggml_gallocr_free_node(ggml_gallocr_t galloc,ggml_tensor *node)

{
  int iVar1;
  ulong uVar2;
  ggml_dyn_tallocr *pgVar3;
  size_t sVar4;
  hash_node *phVar5;
  size_t sVar6;
  free_block *pfVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ggml_dyn_tallocr *pgVar12;
  size_t sVar13;
  uint uVar14;
  bool bVar15;
  
  if ((node->flags & 2) != 0) {
    return;
  }
  phVar5 = ggml_gallocr_hash_get(galloc,node);
  uVar2 = phVar5->offset;
  pgVar3 = galloc->buf_tallocs[phVar5->buffer_id];
  sVar6 = ggml_backend_buft_get_alloc_size(galloc->bufts[phVar5->buffer_id],node);
  uVar11 = pgVar3->alignment;
  sVar6 = (uVar11 - sVar6 % uVar11) % uVar11 + sVar6;
  iVar1 = pgVar3->n_free_blocks;
  uVar11 = (ulong)iVar1;
  if (0 < (long)uVar11) {
    pfVar7 = pgVar3->free_blocks;
    bVar15 = true;
    uVar10 = 0;
    do {
      pfVar7 = pfVar7 + 1;
      sVar4 = pfVar7[-1].offset;
      sVar13 = pfVar7[-1].size;
      iVar9 = (int)uVar10;
      if (sVar13 + sVar4 == uVar2) {
        sVar13 = sVar13 + sVar6;
        pfVar7[-1].size = sVar13;
        uVar14 = iVar1 - 1;
        if ((iVar9 < (int)uVar14) && (sVar4 + sVar13 == pfVar7->offset)) {
          pfVar7[-1].size = sVar13 + pfVar7->size;
          pgVar3->n_free_blocks = uVar14;
          if ((int)(uVar10 + 1) < (int)uVar14) {
            uVar11 = (ulong)uVar14;
            do {
              sVar4 = pfVar7[1].size;
              pfVar7->offset = pfVar7[1].offset;
              pfVar7->size = sVar4;
              uVar11 = uVar11 - 1;
              pfVar7 = pfVar7 + 1;
            } while (uVar10 + 1 != uVar11);
          }
        }
        goto LAB_00124ffa;
      }
      if (sVar6 + uVar2 == sVar4) goto LAB_00124faa;
      uVar10 = uVar10 + 1;
      bVar15 = uVar10 < uVar11;
    } while (uVar11 != uVar10);
  }
LAB_00124fff:
  uVar14 = pgVar3->n_free_blocks;
  lVar8 = (long)(int)uVar14;
  if (0xff < lVar8) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x117,"GGML_ASSERT(%s) failed",
               "alloc->n_free_blocks < MAX_FREE_BLOCKS && \"out of free blocks\"");
  }
  if ((int)uVar14 < 1) {
    uVar11 = 0;
  }
  else {
    uVar10 = 0;
    pfVar7 = pgVar3->free_blocks;
    do {
      uVar11 = uVar10;
      if (uVar2 <= pfVar7->offset) break;
      uVar10 = uVar10 + 1;
      pfVar7 = pfVar7 + 1;
      uVar11 = (ulong)uVar14;
    } while (uVar14 != uVar10);
  }
  if ((int)uVar11 < (int)uVar14) {
    pgVar12 = (ggml_dyn_tallocr *)(pgVar3->free_blocks + lVar8);
    do {
      lVar8 = lVar8 + -1;
      sVar4 = *(size_t *)((long)(pgVar12 + 0xffffffffffffffff) + 0x1010);
      pgVar12->alignment = *(size_t *)((long)(pgVar12 + 0xffffffffffffffff) + 0x1008);
      *(size_t *)&pgVar12->n_free_blocks = sVar4;
      pgVar12 = (ggml_dyn_tallocr *)((long)(pgVar12 + 0xffffffffffffffff) + 0x1008);
    } while ((int)uVar11 < lVar8);
  }
  pgVar3->free_blocks[uVar11 & 0xffffffff].offset = uVar2;
  pgVar3->free_blocks[uVar11 & 0xffffffff].size = sVar6;
  pgVar3->n_free_blocks = pgVar3->n_free_blocks + 1;
LAB_0012506f:
  phVar5->allocated = false;
  return;
LAB_00124faa:
  pfVar7[-1].offset = uVar2;
  pfVar7[-1].size = sVar13 + sVar6;
  if (uVar10 != 0) {
    uVar14 = iVar9 - 1;
    sVar4 = pgVar3->free_blocks[uVar14].size;
    if (pgVar3->free_blocks[uVar14].offset + sVar4 == uVar2) {
      pgVar3->free_blocks[uVar14].size = sVar4 + sVar13 + sVar6;
      pgVar3->n_free_blocks = iVar1 + -1;
      if (iVar9 < iVar1 + -1) {
        lVar8 = (iVar1 - 1) - uVar10;
        do {
          sVar4 = pfVar7->size;
          pfVar7[-1].offset = pfVar7->offset;
          pfVar7[-1].size = sVar4;
          pfVar7 = pfVar7 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
  }
LAB_00124ffa:
  if (bVar15) goto LAB_0012506f;
  goto LAB_00124fff;
}

Assistant:

static void ggml_gallocr_free_node(ggml_gallocr_t galloc, struct ggml_tensor * node) {
    // graph outputs are never freed
    if (node->flags & GGML_TENSOR_FLAG_OUTPUT) {
        AT_PRINTF("not freeing output %s\n", node->name);
        return;
    }

    struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);
    size_t offset = hn->offset;
    int buffer_id = hn->buffer_id;
    struct ggml_dyn_tallocr * alloc = galloc->buf_tallocs[buffer_id];
    ggml_backend_buffer_type_t buft = galloc->bufts[buffer_id];
    size_t size = ggml_backend_buft_get_alloc_size(buft, node);
    ggml_dyn_tallocr_free_tensor(alloc, offset, size, node);
    hn->allocated = false;
}